

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_reset_stream(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                       quicly_sent_t *sent)

{
  int iVar1;
  quicly_stream_t *pqVar2;
  int in_EDX;
  quicly_stream_t *in_RSI;
  long in_RDI;
  quicly_stream_t *stream;
  quicly_conn_t *conn;
  quicly_stream_t *in_stack_ffffffffffffffc8;
  quicly_stream_id_t in_stack_ffffffffffffffd0;
  
  pqVar2 = quicly_get_stream((quicly_conn_t *)(in_RDI + -0x630),in_stack_ffffffffffffffd0);
  if (pqVar2 != (quicly_stream_t *)0x0) {
    on_ack_stream_state_sender(&(pqVar2->_send_aux).reset_stream.sender_state,in_EDX);
    iVar1 = stream_is_destroyable(in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      destroy_stream(in_RSI,in_EDX);
    }
  }
  return 0;
}

Assistant:

static int on_ack_reset_stream(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream_state_sender.stream_id)) != NULL) {
        on_ack_stream_state_sender(&stream->_send_aux.reset_stream.sender_state, acked);
        if (stream_is_destroyable(stream))
            destroy_stream(stream, 0);
    }

    return 0;
}